

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonpatch.hpp
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
jsoncons::jsonpatch::detail::jsonpatch_names<char>::remove_name_abi_cxx11_(void)

{
  int iVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  allocator<char> local_1f;
  undefined1 local_1e;
  undefined1 local_1d;
  undefined1 local_1c;
  undefined1 local_1b;
  undefined1 local_1a;
  undefined1 local_19;
  undefined1 *local_18;
  undefined8 local_10;
  
  if (remove_name[abi:cxx11]()::name_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&remove_name[abi:cxx11]()::name_abi_cxx11_);
    if (iVar1 != 0) {
      local_1e = 0x72;
      local_1d = 0x65;
      local_1c = 0x6d;
      local_1b = 0x6f;
      local_1a = 0x76;
      local_19 = 0x65;
      local_18 = &local_1e;
      local_10 = 6;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&remove_name[abi:cxx11]()::name_abi_cxx11_,local_18,local_10,&local_1f);
      std::allocator<char>::~allocator(&local_1f);
      __cxa_atexit(std::__cxx11::string::~string,&remove_name[abi:cxx11]()::name_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&remove_name[abi:cxx11]()::name_abi_cxx11_);
    }
  }
  std::__cxx11::string::string
            ((string *)in_RDI,(string *)&remove_name[abi:cxx11]()::name_abi_cxx11_);
  return in_RDI;
}

Assistant:

static std::basic_string<CharT> remove_name()
        {
            static std::basic_string<CharT> name{'r','e','m','o','v','e'};
            return name;
        }